

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

void glu::TextureTestUtil::computeQuadTexCoord1DArray
               (vector<float,_std::allocator<float>_> *dst,int layerNdx,float left,float right)

{
  reference pvVar1;
  float right_local;
  float left_local;
  int layerNdx_local;
  vector<float,_std::allocator<float>_> *dst_local;
  
  std::vector<float,_std::allocator<float>_>::resize(dst,8);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,0);
  *pvVar1 = left;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,1);
  *pvVar1 = (float)layerNdx;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,2);
  *pvVar1 = left;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,3);
  *pvVar1 = (float)layerNdx;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,4);
  *pvVar1 = right;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,5);
  *pvVar1 = (float)layerNdx;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,6);
  *pvVar1 = right;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,7);
  *pvVar1 = (float)layerNdx;
  return;
}

Assistant:

void computeQuadTexCoord1DArray (std::vector<float>& dst, int layerNdx, float left, float right)
{
	dst.resize(4*2);

	dst[0] = left;	dst[1] = (float)layerNdx;
	dst[2] = left;	dst[3] = (float)layerNdx;
	dst[4] = right;	dst[5] = (float)layerNdx;
	dst[6] = right;	dst[7] = (float)layerNdx;
}